

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-hand.cpp
# Opt level: O1

int __thiscall mahjong::PlayerHand::remove(PlayerHand *this,char *__filename)

{
  _Base_ptr p_Var1;
  size_type sVar2;
  _Base_ptr p_Var3;
  iterator iVar4;
  const_iterator __position;
  Tile local_14;
  
  local_14 = (Tile)__filename;
  sVar2 = std::
          _Rb_tree<mahjong::Tile,_mahjong::Tile,_std::_Identity<mahjong::Tile>,_std::less<mahjong::Tile>,_std::allocator<mahjong::Tile>_>
          ::count(&(this->tiles)._M_t,&local_14);
  if (sVar2 == 0) {
    __assert_fail("0 < tiles.count(tile)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/src/player-hand.cpp"
                  ,0x13,"void mahjong::PlayerHand::remove(Tile)");
  }
  if ((this->ready_type != not_ready) && (this->last_tile != local_14)) {
    __assert_fail("ready_type == ReadyType::not_ready || last_tile == tile",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/src/player-hand.cpp"
                  ,0x14,"void mahjong::PlayerHand::remove(Tile)");
  }
  __position._M_node = &(this->tiles)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var3 = __position._M_node;
  for (p_Var1 = (this->tiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[(int)p_Var1[1]._M_color < (int)local_14]
      ) {
    if ((int)local_14 <= (int)p_Var1[1]._M_color) {
      p_Var3 = p_Var1;
    }
  }
  if ((p_Var3 != __position._M_node) && ((int)p_Var3[1]._M_color <= (int)local_14)) {
    __position._M_node = p_Var3;
  }
  iVar4 = std::
          _Rb_tree<mahjong::Tile,mahjong::Tile,std::_Identity<mahjong::Tile>,std::less<mahjong::Tile>,std::allocator<mahjong::Tile>>
          ::erase_abi_cxx11_((_Rb_tree<mahjong::Tile,mahjong::Tile,std::_Identity<mahjong::Tile>,std::less<mahjong::Tile>,std::allocator<mahjong::Tile>>
                              *)&this->tiles,__position);
  return (int)iVar4._M_node;
}

Assistant:

void PlayerHand::remove(Tile tile)
{
	assert(0 < tiles.count(tile));
	assert(ready_type == ReadyType::not_ready || last_tile == tile);

	auto it = tiles.find(tile);
	tiles.erase(it);
}